

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_exporttype_t::wasm_exporttype_t(wasm_exporttype_t *this,wasm_exporttype_t *other)

{
  ExportType EStack_38;
  
  wabt::interp::ExportType::ExportType(&EStack_38,&other->I);
  wasm_exporttype_t(this,&EStack_38);
  wabt::interp::ExportType::~ExportType(&EStack_38);
  return;
}

Assistant:

wasm_exporttype_t(const wasm_exporttype_t& other)
      : wasm_exporttype_t(other.I) {}